

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURL * curl_easy_init(void)

{
  CURLcode CVar1;
  code *in_RAX;
  SessionHandle *data;
  SessionHandle *local_8;
  
  if (initialized == 0) {
    initialized = 1;
    Curl_cmalloc = malloc;
    Curl_cfree = free;
    Curl_crealloc = realloc;
    Curl_cstrdup = strdup;
    in_RAX = calloc;
    Curl_ccalloc = calloc;
  }
  local_8 = (SessionHandle *)in_RAX;
  CVar1 = Curl_open(&local_8);
  if (CVar1 != CURLE_OK) {
    local_8 = (SessionHandle *)0x0;
  }
  return local_8;
}

Assistant:

CURL *curl_easy_init(void)
{
  CURLcode res;
  struct SessionHandle *data;

  /* Make sure we inited the global SSL stuff */
  if(!initialized) {
    res = curl_global_init(CURL_GLOBAL_DEFAULT);
    if(res) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      return NULL;
    }
  }

  /* We use curl_open() with undefined URL so far */
  res = Curl_open(&data);
  if(res != CURLE_OK) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}